

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTryTable(PrintExpressionContents *this,TryTable *curr)

{
  ostream *poVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  IString *this_00;
  bool *pbVar5;
  Name *pNVar6;
  char *pcVar7;
  string_view local_70;
  string_view local_60;
  uint local_4c;
  Type TStack_48;
  Index i;
  Type local_40;
  Signature local_38;
  string_view local_28;
  TryTable *local_18;
  TryTable *curr_local;
  PrintExpressionContents *this_local;
  
  poVar1 = this->o;
  local_18 = curr;
  curr_local = (TryTable *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"try_table");
  printMedium(poVar1,local_28);
  bVar2 = wasm::Type::isConcrete
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)53>).
                      super_Expression.type);
  if (bVar2) {
    std::operator<<(this->o,' ');
    wasm::Type::Type(&local_40,none);
    TStack_48.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.
                   type.id;
    Signature::Signature(&local_38,local_40,TStack_48);
    printBlockType(this,local_38);
  }
  for (local_4c = 0; uVar3 = (ulong)local_4c,
      sVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(local_18->catchTags).
                          super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>), uVar3 < sVar4
      ; local_4c = local_4c + 1) {
    std::operator<<(this->o," (");
    this_00 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(local_18->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)local_4c)->super_IString;
    bVar2 = IString::operator_cast_to_bool(this_00);
    if (bVar2) {
      poVar1 = this->o;
      pbVar5 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                         (&(local_18->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                          (ulong)local_4c);
      pcVar7 = "catch ";
      if ((*pbVar5 & 1U) != 0) {
        pcVar7 = "catch_ref ";
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,pcVar7);
      printMedium(poVar1,local_60);
      pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(local_18->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)local_4c);
      wasm::Name::print(pNVar6,this->o);
      std::operator<<(this->o,' ');
    }
    else {
      poVar1 = this->o;
      pbVar5 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                         (&(local_18->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                          (ulong)local_4c);
      pcVar7 = "catch_all ";
      if ((*pbVar5 & 1U) != 0) {
        pcVar7 = "catch_all_ref ";
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,pcVar7);
      printMedium(poVar1,local_70);
    }
    pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(local_18->catchDests).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)local_4c)
    ;
    wasm::Name::print(pNVar6,this->o);
    std::operator<<(this->o,')');
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
    printMedium(o, "try_table");
    if (curr->type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, curr->type));
    }
    for (Index i = 0; i < curr->catchTags.size(); i++) {
      o << " (";
      if (curr->catchTags[i]) {
        printMedium(o, curr->catchRefs[i] ? "catch_ref " : "catch ");
        curr->catchTags[i].print(o);
        o << ' ';
      } else {
        printMedium(o, curr->catchRefs[i] ? "catch_all_ref " : "catch_all ");
      }
      curr->catchDests[i].print(o);
      o << ')';
    }
  }